

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O1

void __thiscall
gl4cts::DirectStateAccess::Renderbuffers::StorageMultisampleTest::Clear
          (StorageMultisampleTest *this,bool isColorIntegralFormat)

{
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  undefined7 in_register_00000031;
  long lVar2;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  if ((int)CONCAT71(in_register_00000031,isColorIntegralFormat) != 0) {
    (**(code **)(lVar2 + 0x1b0))(0x1800,0,s_reference_color_integer);
    err = (**(code **)(lVar2 + 0x800))();
    glu::checkError(err,"glClearBufferiv has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x21cc);
    return;
  }
  (**(code **)(lVar2 + 0x1c0))(0x3e800000,0x3f000000,0x3f400000,0x3f800000);
  (**(code **)(lVar2 + 0x1c8))(0x3fe0000000000000);
  (**(code **)(lVar2 + 0x208))(7);
  (**(code **)(lVar2 + 0x188))(0x4500);
  return;
}

Assistant:

void StorageMultisampleTest::Clear(bool isColorIntegralFormat)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (isColorIntegralFormat)
	{
		gl.clearBufferiv(GL_COLOR, 0, s_reference_color_integer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glClearBufferiv has failed");
	}
	else
	{
		/* Setup clear values. */
		gl.clearColor(s_reference_color[0], s_reference_color[1], s_reference_color[2], s_reference_color[3]);
		gl.clearDepth(s_reference_depth);
		gl.clearStencil(s_reference_stencil);

		/* Clear rbo/fbo. */
		gl.clear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);
	}
}